

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::BinaryStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (BinaryStrOperator *this,string_t input,Vector *result)

{
  byte bVar1;
  byte bVar2;
  ulong uVar9;
  ulong uVar10;
  undefined4 *puVar11;
  long lVar12;
  string_t target;
  undefined1 local_30 [16];
  undefined8 local_20;
  long local_18;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  local_18 = input.value._0_8_;
  uVar10 = (ulong)this & 0xffffffff;
  lVar12 = local_18;
  if (uVar10 < 0xd) {
    lVar12 = (long)&local_20 + 4;
  }
  local_20 = this;
  local_30 = (undefined1  [16])
             StringVector::EmptyString
                       (input.value._8_8_,(Vector *)(uVar10 * 8),(idx_t)input.value._8_8_);
  if (uVar10 != 0) {
    puVar11 = (undefined4 *)local_30._8_8_;
    if ((uint)local_30._0_4_ < 0xd) {
      puVar11 = (undefined4 *)(local_30 + 4);
    }
    uVar9 = 0;
    do {
      bVar1 = *(byte *)(lVar12 + uVar9);
      bVar8 = bVar1 >> 1;
      bVar7 = bVar1 >> 2;
      bVar6 = bVar1 >> 3;
      bVar5 = bVar1 >> 4;
      bVar4 = bVar1 >> 5;
      bVar3 = bVar1 >> 6;
      bVar2 = -((char)bVar1 >> 7);
      bVar2 = (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2);
      bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
      bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
      bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
      bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
      bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
      bVar1 = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
      *(ulong *)(puVar11 + uVar9 * 2) =
           CONCAT17((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                    CONCAT16((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                             CONCAT15((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                      CONCAT14((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                               (0xff < bVar6),
                                               CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                        (0xff < bVar5),
                                                        CONCAT12((bVar4 != 0) * (bVar4 < 0x100) *
                                                                 bVar4 - (0xff < bVar4),
                                                                 CONCAT11((bVar3 != 0) *
                                                                          (bVar3 < 0x100) * bVar3 -
                                                                          (0xff < bVar3),
                                                                          (bVar2 != 0) *
                                                                          (bVar2 < 0x100) * bVar2 -
                                                                          (0xff < bVar2)))))))) &
           0x101010101010101 | 0x3030303030303030;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  uVar10 = (ulong)(uint)local_30._0_4_;
  if (uVar10 < 0xd) {
    switchD_01306cb1::default((void *)((long)(local_30 + 4) + uVar10),0,0xc - uVar10);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 8);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			auto byte = static_cast<uint8_t>(data[i]);
			for (idx_t i = 8; i >= 1; --i) {
				*output = ((byte >> (i - 1)) & 0x01) + '0';
				output++;
			}
		}

		target.Finalize();
		return target;
	}